

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O3

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this,
          MatrixType *matrix)

{
  NCMatrix *this_00;
  PermutationType *this_01;
  undefined4 *puVar1;
  long lVar2;
  string *psVar3;
  Index IVar4;
  Index *pIVar5;
  Index *pIVar6;
  Index *pIVar7;
  PermutationType *pPVar8;
  bool bVar9;
  int w;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  Index size_2;
  Index *pIVar16;
  ulong uVar17;
  undefined8 *puVar18;
  double *pdVar19;
  int iVar20;
  Index index;
  ulong uVar21;
  PermutationType *pPVar22;
  char *pcVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  Index alignedEnd;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *pSVar30;
  void *__ptr;
  int *piVar31;
  int iVar32;
  GlobalLU_t *pGVar33;
  Index IVar34;
  Index m;
  int *piVar35;
  undefined1 local_3b8 [8];
  ostringstream returnInfo;
  int iStack_3ac;
  ios_base local_348 [264];
  BlockIndexVector local_240;
  int *local_228;
  ulong local_220;
  double *local_210;
  ulong local_208;
  int *local_1f8;
  ulong local_1f0;
  int *local_1e0;
  ulong local_1d8;
  int *local_1c8;
  ulong local_1c0;
  double *local_1b0;
  ulong local_1a8;
  int *local_198;
  ulong local_190;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 local_160 [8];
  PermutationType iperm_c;
  int local_12c;
  undefined1 auStack_128 [4];
  Index pivrow;
  ulong local_120;
  IndexVector local_118;
  undefined1 local_108 [8];
  IndexVector relax_end;
  DenseStorage<double,__1,__1,_1,_0> local_e8;
  IndexVector local_d8;
  DenseStorage<double,__1,__1,_1,_0> local_c8;
  IndexVector local_b0;
  IndexVector local_a0;
  ulong local_90;
  IndexVector local_88;
  int local_74;
  void *pvStack_70;
  Index nseg1;
  GlobalLU_t *local_68;
  PermutationType *local_60;
  int *local_58;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *local_50;
  int local_44;
  uint uStack_40;
  Index nseg;
  ulong local_38;
  Index othersize;
  
  if (this->m_analysisIsOk == false) {
    __assert_fail("m_analysisIsOk && \"analyzePattern() should be called first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c8,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  if (matrix->m_innerSize != matrix->m_outerSize) {
    __assert_fail("(matrix.rows() == matrix.cols()) && \"Only for squared matrices\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c9,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  this_00 = &this->m_mat;
  SparseMatrix<double,_0,_int>::operator=(this_00,matrix);
  local_60 = &this->m_perm_c;
  if ((int)(this->m_perm_c).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows == 0) {
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_60,
               (long)matrix->m_outerSize);
    if (0 < matrix->m_outerSize) {
      piVar31 = (this->m_perm_c).m_indices.
                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar25 = (this->m_perm_c).m_indices.
               super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar28 = 0;
      if (lVar25 < 1) {
        lVar25 = lVar28;
      }
      do {
        if (lVar25 == lVar28) goto LAB_001475cc;
        piVar31[lVar28] = (int)lVar28;
        lVar28 = lVar28 + 1;
      } while (lVar28 < matrix->m_outerSize);
    }
  }
  else {
    SparseMatrix<double,_0,_int>::uncompress(this_00);
    pIVar5 = matrix->m_innerNonZeros;
    if (pIVar5 == (Index *)0x0) {
      pIVar16 = matrix->m_outerIndex;
      IVar34 = matrix->m_outerSize;
LAB_0014648c:
      if (0 < IVar34) {
        lVar28 = (this->m_perm_c).m_indices.
                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pIVar6 = (this->m_mat).m_outerIndex;
        pIVar7 = (this->m_mat).m_innerNonZeros;
        piVar31 = (this->m_perm_c).m_indices.
                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        lVar25 = 0;
        if (lVar28 < 1) {
          lVar28 = lVar25;
        }
        do {
          if (lVar28 == lVar25) goto LAB_001475cc;
          iVar13 = pIVar16[lVar25];
          pIVar6[piVar31[lVar25]] = iVar13;
          lVar2 = lVar25 + 1;
          piVar35 = piVar31 + lVar25;
          lVar25 = lVar25 + 1;
          pIVar7[*piVar35] = pIVar16[lVar2] - iVar13;
        } while (lVar25 < matrix->m_outerSize);
      }
    }
    else {
      IVar34 = matrix->m_outerSize;
      uVar27 = 0xffffffffffffffff;
      if (-2 < IVar34) {
        uVar27 = (long)(int)(IVar34 + 1U) << 2;
      }
      pIVar16 = (Index *)operator_new__(uVar27);
      if (-1 < IVar34) {
        pIVar6 = (this->m_mat).m_outerIndex;
        uVar27 = 0;
        do {
          pIVar16[uVar27] = pIVar6[uVar27];
          uVar27 = uVar27 + 1;
        } while (IVar34 + 1U != uVar27);
        goto LAB_0014648c;
      }
    }
    if ((pIVar5 != (Index *)0x0) && (pIVar16 != (Index *)0x0)) {
      operator_delete__(pIVar16);
    }
  }
  uVar29 = (this->m_mat).m_outerSize;
  uVar27 = (ulong)uVar29;
  uVar15 = (this->m_mat).m_innerSize;
  uVar17 = (ulong)uVar15;
  local_58 = (int *)(long)(int)uVar29;
  pPVar8 = (PermutationType *)(this->m_mat).m_innerNonZeros;
  if (pPVar8 == (PermutationType *)0x0) {
    iVar13 = (int)(this->m_mat).m_data.m_size;
  }
  else {
    local_3b8 = (undefined1  [8])pPVar8;
    _returnInfo = (long)local_58;
    if ((int)uVar29 < 0) {
      __assert_fail("vecSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                    ,0x8a,
                    "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<int, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<int, -1, 1>>, Level = 0]"
                   );
    }
    if (uVar29 == 0) {
      iVar13 = 0;
    }
    else {
      iVar13 = internal::
               redux_impl<Eigen::internal::scalar_sum_op<int>,_Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_0>
               ::run((Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                     local_3b8,(scalar_sum_op<int> *)local_180);
    }
  }
  uVar14 = (this->m_perfv).panel_size;
  uVar21 = (ulong)uVar14;
  pGVar33 = &this->m_glu;
  iVar13 = internal::SparseLUImpl<double,_int>::memInit
                     ((SparseLUImpl<double,_int> *)this,uVar15,uVar29,iVar13,0,
                      (this->m_perfv).fillfactor,uVar14,pGVar33);
  if (iVar13 != 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_lastError,0,(char *)(this->m_lastError)._M_string_length,0x19c2a2);
    this->m_factorizationIsOk = false;
    return;
  }
  uVar24 = (ulong)(int)uVar15;
  local_90 = uVar27;
  local_68 = pGVar33;
  _uStack_40 = uVar17;
  local_38 = uVar21;
  if (uVar15 == 0) {
    local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)0x0;
    uVar27 = 0;
LAB_0014663f:
    bVar9 = false;
    iVar13 = (int)local_38;
  }
  else {
    if (((int)uVar15 < 0) ||
       (local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (int *)malloc(uVar24 * 4),
       local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
       (int *)0x0)) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar18 = std::streambuf::xsgetn;
      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar27 = (ulong)(uVar15 & 0x7ffffffc);
    bVar9 = uVar15 >= 4;
    if (uVar15 < 4) goto LAB_0014663f;
    uVar17 = 0;
    iVar13 = (int)local_38;
    do {
      *(undefined1 (*) [16])
       (local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
       uVar17) = (undefined1  [16])0x0;
      uVar17 = uVar17 + 4;
    } while (uVar17 < uVar27);
  }
  piVar31 = local_58;
  local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar24;
  local_38 = uVar24;
  if ((long)uVar27 < (long)uVar24) {
    uVar17 = _uStack_40 >> 2 & 0x3fffffff;
    memset(local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           uVar17 * 4,0,uVar24 * 4 + uVar17 * -0x10);
  }
  if (uStack_40 == 0) {
    _auStack_128 = (int *)0x0;
  }
  else {
    _auStack_128 = (int *)malloc(local_38 * 4);
    if (_auStack_128 == (int *)0x0) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar18 = std::streambuf::xsgetn;
      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  if (bVar9) {
    uVar17 = 0;
    do {
      *(undefined1 (*) [16])(_auStack_128 + uVar17) = (undefined1  [16])0x0;
      uVar17 = uVar17 + 4;
    } while (uVar17 < uVar27);
  }
  local_120 = local_38;
  if ((long)uVar27 < (long)local_38) {
    uVar17 = _uStack_40 >> 2 & 0x3fffffff;
    memset(_auStack_128 + uVar17 * 4,0,local_38 * 4 + uVar17 * -0x10);
  }
  if (uStack_40 == 0) {
    local_118.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)0x0;
  }
  else {
    local_118.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)malloc(local_38 * 4);
    if (local_118.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (int *)0x0) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar18 = std::streambuf::xsgetn;
      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  if (bVar9) {
    uVar17 = 0;
    do {
      *(undefined1 (*) [16])
       (local_118.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
       uVar17) = (undefined1  [16])0x0;
      uVar17 = uVar17 + 4;
    } while (uVar17 < uVar27);
  }
  uVar29 = iVar13 * (uint)_uStack_40;
  local_118.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = local_38;
  if ((long)uVar27 < (long)local_38) {
    uVar27 = (ulong)((uint)_uStack_40 >> 2);
    memset(local_118.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           uVar27 * 4,0,local_38 * 4 + uVar27 * -0x10);
  }
  uVar27 = (ulong)(int)uVar29;
  local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar27;
  if (uVar29 == 0) {
    local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)0x0;
    relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  }
  else {
    if ((int)uVar29 < 0) {
LAB_001476a1:
      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar18 = std::streambuf::xsgetn;
      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)malloc(uVar27 * 4);
    if (local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (int *)0x0) goto LAB_001476a1;
    relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (DenseIndex)malloc(uVar27 * 4);
    if ((void *)relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows == (void *)0x0) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar18 = std::streambuf::xsgetn;
      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  uVar17 = local_90;
  uVar15 = (uint)local_90;
  if (uVar15 == 0) {
    local_d8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)0x0;
    uVar21 = 0;
  }
  else {
    if (((int)uVar15 < 0) ||
       (local_d8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (int *)malloc((long)piVar31 * 4),
       local_d8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
       (int *)0x0)) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar18 = std::streambuf::xsgetn;
      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar21 = (ulong)((uint)piVar31 & 0x7ffffffc);
    if (3 < uVar15) {
      uVar24 = 0;
      do {
        *(undefined1 (*) [16])
         (local_d8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
         uVar24) = (undefined1  [16])0x0;
        uVar24 = uVar24 + 4;
      } while (uVar24 < uVar21);
    }
  }
  local_d8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (DenseIndex)piVar31;
  if ((long)uVar21 < (long)piVar31) {
    uVar17 = uVar17 >> 2 & 0x3fffffff;
    memset(local_d8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           uVar17 * 4,0,(long)piVar31 * 4 + uVar17 * -0x10);
  }
  uVar15 = (int)_uStack_40 * 3;
  uVar17 = (ulong)uVar15;
  if ((int)_uStack_40 == 0) {
    local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)0x0;
    uVar14 = 0;
  }
  else {
    local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)malloc(uVar17 * 4);
    if (local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (int *)0x0) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar18 = std::streambuf::xsgetn;
      __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar14 = uVar15 & 0x7ffffffc;
    if (uStack_40 != 1) {
      uVar21 = 0;
      do {
        *(undefined1 (*) [16])
         (local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
         uVar21) = (undefined1  [16])0x0;
        uVar21 = uVar21 + 4;
      } while (uVar21 < uVar14);
    }
  }
  local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar17;
  if (uVar14 != uVar15) {
    memset((void *)((uVar17 << 2 & 0x1fffffff0) +
                   (long)local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data),0,uVar17 << 2 & 0x20000000c);
  }
  if (-1 < local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    if (3 < (ulong)local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows) {
      uVar17 = 0;
      do {
        piVar31 = local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data + uVar17;
        *piVar31 = -1;
        piVar31[1] = -1;
        piVar31[2] = -1;
        piVar31[3] = -1;
        uVar17 = uVar17 + 4;
      } while (uVar17 < (local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows & 0x7ffffffffffffffcU));
    }
    if ((long)(local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              & 0x7ffffffffffffffcU) <
        local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      memset((void *)((local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows << 2 & 0xfffffffffffffff0U) +
                     (long)local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data),0xff,
             (ulong)((uint)(local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows << 2) & 0xc));
    }
    if (-1 < (long)uVar27) {
      if (3 < uVar27) {
        uVar17 = 0;
        do {
          puVar1 = (undefined4 *)
                   (relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows + uVar17 * 4);
          *puVar1 = 0xffffffff;
          puVar1[1] = 0xffffffff;
          puVar1[2] = 0xffffffff;
          puVar1[3] = 0xffffffff;
          uVar17 = uVar17 + 4;
        } while (uVar17 < (uVar27 & 0x7ffffffffffffffc));
      }
      if ((long)(uVar27 & 0x7ffffffffffffffc) < (long)uVar27) {
        memset((void *)((uVar27 << 2 & 0xfffffffffffffff0) +
                       relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows),0xff,(ulong)((uint)(uVar27 << 2) & 0xc));
      }
      local_c8.m_data = (double *)0x0;
      local_c8.m_rows = 0;
      if ((int)uVar29 < 0) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                      ,0x10c,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (uVar29 == 0) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar27;
        local_c8 = (DenseStorage<double,__1,__1,_1,_0>)(auVar10 << 0x40);
        uVar17 = 0;
      }
      else {
        pdVar19 = (double *)malloc(uVar27 * 8);
        if (pdVar19 == (double *)0x0) {
          puVar18 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar18 = std::streambuf::xsgetn;
          __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_c8.m_rows = uVar27;
        local_c8.m_data = pdVar19;
        uVar17 = (ulong)(uVar29 & 0x7ffffffe);
        if (uVar29 != 1) {
          uVar21 = 0;
          do {
            *(undefined1 (*) [16])(pdVar19 + uVar21) = (undefined1  [16])0x0;
            uVar21 = uVar21 + 2;
          } while (uVar21 < uVar17);
        }
      }
      if ((long)uVar17 < (long)uVar27) {
        memset(local_c8.m_data + (ulong)(uVar29 >> 1) * 2,0,
               uVar27 * 8 + (ulong)(uVar29 >> 1) * -0x10);
      }
      uVar17 = _uStack_40;
      local_e8.m_data = (double *)0x0;
      local_e8.m_rows = 0;
      m = (Index)_uStack_40;
      uVar29 = ((this->m_perfv).maxsuper + m) * (this->m_perfv).panel_size;
      uVar21 = (ulong)uVar29;
      if ((int)uVar29 < m) {
        uVar21 = _uStack_40 & 0xffffffff;
      }
      uVar29 = (uint)uVar21;
      if (uVar29 == 0) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar21;
        local_e8 = (DenseStorage<double,__1,__1,_1,_0>)(auVar11 << 0x40);
        uVar15 = 0;
      }
      else {
        pdVar19 = (double *)malloc(uVar21 * 8);
        if (pdVar19 == (double *)0x0) {
          puVar18 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar18 = std::streambuf::xsgetn;
          __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_e8.m_rows = uVar21;
        local_e8.m_data = pdVar19;
        uVar15 = uVar29 & 0x7ffffffe;
        if (uVar21 != 1) {
          uVar24 = 0;
          do {
            *(undefined1 (*) [16])(pdVar19 + uVar24) = (undefined1  [16])0x0;
            uVar24 = uVar24 + 2;
          } while (uVar24 < uVar15);
        }
      }
      if (uVar15 != uVar29) {
        memset(local_e8.m_data + (uVar21 >> 1) * 2,0,uVar21 * 8 + (uVar21 >> 1) * -0x10);
      }
      local_3b8 = (undefined1  [8])local_60;
      PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
                ((PermutationMatrix<_1,_1,int> *)local_160,
                 (Transpose<Eigen::PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_>_> *)
                 local_3b8);
      relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           local_58;
      pGVar33 = local_68;
      if ((int)local_90 == 0) {
        local_108 = (undefined1  [8])0x0;
      }
      else {
        local_108 = (undefined1  [8])malloc((long)local_58 * 4);
        if (local_108 == (undefined1  [8])0x0) {
          puVar18 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar18 = std::streambuf::xsgetn;
          __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      iVar13 = (this->m_perfv).relax;
      if (this->m_symmetricmode == true) {
        internal::SparseLUImpl<double,_int>::heap_relax_snode
                  ((SparseLUImpl<double,_int> *)this,(int)local_90,&this->m_etree,iVar13,&local_88,
                   (IndexVector *)local_108);
      }
      else {
        internal::SparseLUImpl<double,_int>::relax_snode
                  ((SparseLUImpl<double,_int> *)this,(int)local_90,&this->m_etree,iVar13,&local_88,
                   (IndexVector *)local_108);
      }
      this_01 = &this->m_perm_r;
      PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this_01,local_38);
      local_3b8 = (undefined1  [8])
                  (this->m_perm_r).m_indices.
                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      iStack_3ac = 0xffffffff;
      if (-1 < (long)local_3b8) {
        PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
        resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)this_01,
                   (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                    *)local_3b8);
        pPVar8 = (PermutationType *)
                 (this->m_perm_r).m_indices.
                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if ((undefined1  [8])pPVar8 != local_3b8) {
LAB_0014774a:
          __assert_fail("rows() == other.rows() && cols() == other.cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                        ,0x1f2,
                        "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
                       );
        }
        pPVar22 = (PermutationType *)
                  ((long)&(pPVar8->m_indices).
                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + 3);
        if (-1 < (long)pPVar8) {
          pPVar22 = pPVar8;
        }
        pPVar22 = (PermutationType *)((ulong)pPVar22 & 0xfffffffffffffffc);
        if (3 < (long)pPVar8) {
          lVar25 = 0;
          do {
            piVar31 = (this_01->m_indices).
                      super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                      lVar25;
            *piVar31 = local_3b8._4_4_;
            piVar31[1] = local_3b8._4_4_;
            piVar31[2] = local_3b8._4_4_;
            piVar31[3] = local_3b8._4_4_;
            lVar25 = lVar25 + 4;
          } while (lVar25 < (long)pPVar22);
        }
        if ((long)pPVar22 < (long)pPVar8) {
          piVar31 = (this_01->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                    .m_storage.m_data;
          do {
            piVar31[(long)pPVar22] = iStack_3ac;
            pPVar22 = (PermutationType *)
                      ((long)&(pPVar22->m_indices).
                              super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                              m_data + 1);
          } while (pPVar8 != pPVar22);
        }
        if (-1 < local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
          if (3 < (ulong)local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows) {
            uVar21 = 0;
            do {
              piVar31 = local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data + uVar21;
              *piVar31 = -1;
              piVar31[1] = -1;
              piVar31[2] = -1;
              piVar31[3] = -1;
              uVar21 = uVar21 + 4;
            } while (uVar21 < (local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows & 0x7ffffffffffffffcU));
          }
          if ((long)(local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows & 0x7ffffffffffffffcU) <
              local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            memset((void *)((local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows << 2 & 0xfffffffffffffff0U) +
                           (long)local_88.
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data),0xff,
                   (ulong)((uint)(local_88.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows << 2) & 0xc));
          }
          uVar21 = local_90;
          this->m_detPermR = 1;
          iVar13 = (int)local_90;
          if (0 < (this->m_glu).supno.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows) {
            *(this->m_glu).supno.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data = -1;
            local_3b8 = (undefined1  [8])
                        (this->m_glu).xsup.
                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            _returnInfo = _returnInfo & 0xffffffff;
            if ((long)local_3b8 < 0) goto LAB_0014772b;
            PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
            resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
                      ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)pGVar33,
                       (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                        *)local_3b8);
            pPVar8 = (PermutationType *)
                     (this->m_glu).xsup.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if ((undefined1  [8])pPVar8 != local_3b8) goto LAB_0014774a;
            pPVar22 = (PermutationType *)
                      ((long)&(pPVar8->m_indices).
                              super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                              m_data + 3);
            if (-1 < (long)pPVar8) {
              pPVar22 = pPVar8;
            }
            pPVar22 = (PermutationType *)((ulong)pPVar22 & 0xfffffffffffffffc);
            if (3 < (long)pPVar8) {
              lVar25 = 0;
              do {
                piVar31 = (pGVar33->xsup).
                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + lVar25;
                *piVar31 = local_3b8._4_4_;
                piVar31[1] = local_3b8._4_4_;
                piVar31[2] = local_3b8._4_4_;
                piVar31[3] = local_3b8._4_4_;
                lVar25 = lVar25 + 4;
              } while (lVar25 < (long)pPVar22);
            }
            if ((long)pPVar22 < (long)pPVar8) {
              piVar31 = (pGVar33->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              do {
                piVar31[(long)pPVar22] = iStack_3ac;
                pPVar22 = (PermutationType *)
                          ((long)&(pPVar22->m_indices).
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + 1);
              } while (pPVar8 != pPVar22);
            }
            if ((((0 < (this->m_glu).xlusup.
                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
                 && (*(this->m_glu).xlusup.
                      super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                          0, 0 < (this->m_glu).xusub.
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows)) &&
                (*(this->m_glu).xusub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data = 0,
                0 < (this->m_glu).xlsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows)) &&
               (*(this->m_glu).xlsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data = 0,
               0 < (this->m_glu).xsup.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows)) {
              *(pGVar33->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
               .m_data = 0;
              local_60 = this_01;
              if (iVar13 == 0) {
                iVar13 = 0;
                __ptr = (void *)0x0;
              }
              else {
                pvStack_70 = malloc((long)local_58 << 2);
                if (pvStack_70 == (void *)0x0) {
                  puVar18 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar18 = std::streambuf::xsgetn;
                  __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                iperm_c.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows = (DenseIndex)&this->m_diagpivotthresh;
                piVar31 = (int *)0x0;
                local_50 = this;
                do {
                  pSVar30 = local_50;
                  pGVar33 = local_68;
                  iVar13 = (local_50->m_perfv).panel_size;
                  iVar32 = (int)piVar31;
                  iVar26 = (int)uVar21;
                  iVar20 = iVar13 + iVar32;
                  if (iVar26 < iVar13 + iVar32) {
                    iVar20 = iVar26;
                  }
                  lVar28 = (long)iVar32;
                  lVar25 = 0;
                  do {
                    lVar2 = lVar28 + 1 + lVar25;
                    if (iVar20 <= lVar2) {
                      iVar20 = (int)lVar25 + iVar32 + 1;
                      goto LAB_00146f2a;
                    }
                    if ((iVar32 < -1) ||
                       ((long)relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data <= lVar2)) goto LAB_001475cc;
                    lVar2 = lVar25 + 1;
                    lVar12 = lVar25 + 1;
                    lVar25 = lVar2;
                  } while (*(int *)((long)local_108 + (lVar28 + lVar12) * 4) == -1);
                  iVar13 = (int)lVar2;
                  iVar20 = iVar32 + iVar13;
LAB_00146f2a:
                  w = iVar26 - iVar32;
                  if (iVar20 != iVar26) {
                    w = iVar13;
                  }
                  local_58 = piVar31;
                  internal::SparseLUImpl<double,_int>::panel_dfs
                            ((SparseLUImpl<double,_int> *)local_50,(int)uVar17,w,iVar32,this_00,
                             &local_60->m_indices,&local_74,(ScalarVector *)&local_c8,
                             (IndexVector *)
                             &relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,&local_b0,&local_a0,&local_d8,&local_88,
                             (IndexVector *)auStack_128,&local_118,local_68);
                  internal::SparseLUImpl<double,_int>::panel_bmod
                            ((SparseLUImpl<double,_int> *)pSVar30,(int)_uStack_40,w,(int)local_58,
                             local_74,(ScalarVector *)&local_c8,(ScalarVector *)&local_e8,&local_b0,
                             &local_a0,pGVar33);
                  uVar29 = w + (int)local_58;
                  piVar31 = (int *)(ulong)uVar29;
                  if (0 < w) {
                    lVar25 = lVar28;
                    do {
                      uVar17 = (lVar25 - lVar28) * local_38;
                      local_44 = local_74;
                      if ((((long)(uVar17 | local_38) < 0) ||
                          ((long)(uVar27 - local_38) < (long)uVar17)) ||
                         ((long)(local_a0.
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows - local_38) < (long)uVar17)) {
LAB_001475ef:
                        pcVar23 = 
                        "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                        ;
LAB_0014761b:
                        __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                                      ,0x8d,pcVar23);
                      }
                      local_240.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ = relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                               .m_storage.m_rows + uVar17 * 4;
                      piVar35 = local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                .m_storage.m_data + uVar17;
                      local_240.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._8_8_ = local_38;
                      local_220 = local_38;
                      iVar32 = (int)lVar25;
                      local_228 = piVar35;
                      iVar13 = internal::SparseLUImpl<double,_int>::column_dfs
                                         ((SparseLUImpl<double,_int> *)local_50,(int)_uStack_40,
                                          iVar32,&local_60->m_indices,(local_50->m_perfv).maxsuper,
                                          &local_44,&local_240,&local_b0,
                                          (BlockIndexVector *)&local_228,&local_d8,&local_88,
                                          (IndexVector *)auStack_128,&local_118,local_68);
                      pSVar30 = local_50;
                      if (iVar13 != 0) {
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_50->m_lastError,0,
                                   (char *)(local_50->m_lastError)._M_string_length,0x19c2c6);
                        goto LAB_00147453;
                      }
                      if ((long)(local_c8.m_rows - local_38) < (long)uVar17) {
                        pcVar23 = 
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                        ;
                        goto LAB_0014761b;
                      }
                      uVar24 = (ulong)local_74;
                      uVar21 = local_38 - uVar24;
                      if ((int)uVar21 < 0 &&
                          local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data + uVar24 != (int *)0x0) {
                        __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                                      ,0x94,
                                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 0]"
                                     );
                      }
                      if (((long)(uVar21 | uVar24) < 0) ||
                         ((long)(local_b0.
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows - uVar21) < (long)uVar24)) goto LAB_001475ef;
                      pdVar19 = local_c8.m_data + uVar17;
                      local_208 = local_38;
                      local_1d8 = local_38;
                      local_210 = pdVar19;
                      local_1f8 = local_b0.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + uVar24;
                      local_1f0 = uVar21;
                      local_1e0 = piVar35;
                      iVar13 = internal::SparseLUImpl<double,_int>::column_bmod
                                         ((SparseLUImpl<double,_int> *)local_50,iVar32,
                                          local_44 - local_74,(BlockScalarVector *)&local_210,
                                          (ScalarVector *)&local_e8,(BlockIndexVector *)&local_1f8,
                                          (BlockIndexVector *)&local_1e0,(int)local_58,local_68);
                      pSVar30 = local_50;
                      if (iVar13 != 0) {
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_50->m_lastError,0,
                                   (char *)(local_50->m_lastError)._M_string_length,0x19c2ef);
LAB_00147453:
                        pSVar30->m_info = NumericalIssue;
                        pSVar30->m_factorizationIsOk = false;
                        __ptr = pvStack_70;
                        goto LAB_00147514;
                      }
                      local_1c0 = local_38;
                      local_1a8 = local_38;
                      local_1c8 = piVar35;
                      local_1b0 = pdVar19;
                      iVar13 = internal::SparseLUImpl<double,_int>::copy_to_ucol
                                         ((SparseLUImpl<double,_int> *)local_50,iVar32,local_44,
                                          &local_b0,(BlockIndexVector *)&local_1c8,
                                          &local_60->m_indices,(BlockScalarVector *)&local_1b0,
                                          local_68);
                      pSVar30 = local_50;
                      if (iVar13 != 0) {
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_50->m_lastError,0,
                                   (char *)(local_50->m_lastError)._M_string_length,0x19c319);
                        goto LAB_00147453;
                      }
                      iVar13 = internal::SparseLUImpl<double,_int>::pivotL
                                         ((SparseLUImpl<double,_int> *)local_50,iVar32,
                                          (RealScalar *)
                                          iperm_c.m_indices.
                                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows,&local_60->m_indices,
                                          (IndexVector *)local_160,&local_12c,local_68);
                      pSVar30 = local_50;
                      if (iVar13 != 0) {
                        psVar3 = &local_50->m_lastError;
                        std::__cxx11::string::_M_replace
                                  ((ulong)psVar3,0,(char *)(local_50->m_lastError)._M_string_length,
                                   0x19c344);
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
                        std::ostream::operator<<(local_3b8,iVar13);
                        std::__cxx11::stringbuf::str();
                        std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_180[0]);
                        if (local_180[0] != local_170) {
                          operator_delete(local_180[0]);
                        }
                        pSVar30->m_info = NumericalIssue;
                        pSVar30->m_factorizationIsOk = false;
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
                        std::ios_base::~ios_base(local_348);
                        __ptr = pvStack_70;
                        goto LAB_00147514;
                      }
                      if (local_12c != iVar32) {
                        local_50->m_detPermR = -local_50->m_detPermR;
                      }
                      local_190 = local_38;
                      local_198 = piVar35;
                      internal::SparseLUImpl<double,_int>::pruneL
                                ((SparseLUImpl<double,_int> *)local_50,iVar32,&local_60->m_indices,
                                 local_12c,local_44,&local_b0,(BlockIndexVector *)&local_198,
                                 &local_d8,local_68);
                      if (0 < local_44) {
                        uVar17 = local_b0.
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows;
                        if (local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows < 1) {
                          uVar17 = 0;
                        }
                        uVar21 = 0;
                        do {
                          if (uVar17 == uVar21) goto LAB_001475cc;
                          if (uStack_40 <=
                              (uint)local_b0.
                                    super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data[uVar21]) {
                            pcVar23 = 
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 1]"
                            ;
                            goto LAB_001475e1;
                          }
                          piVar35[local_b0.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data[uVar21]] = -1;
                          uVar21 = uVar21 + 1;
                        } while ((long)uVar21 < (long)local_44);
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < (int)uVar29);
                  }
                  m = (Index)_uStack_40;
                  iVar13 = (int)local_90;
                  uVar21 = local_90;
                  __ptr = pvStack_70;
                  this = local_50;
                  pGVar33 = local_68;
                  uVar17 = _uStack_40;
                } while ((int)uVar29 < iVar13);
              }
              internal::SparseLUImpl<double,_int>::countnz
                        ((SparseLUImpl<double,_int> *)this,iVar13,&this->m_nnzL,&this->m_nnzU,
                         pGVar33);
              internal::SparseLUImpl<double,_int>::fixupL
                        ((SparseLUImpl<double,_int> *)this,iVar13,&local_60->m_indices,pGVar33);
              internal::MappedSuperNodalMatrix<double,_int>::setInfos
                        (&this->m_Lstore,m,iVar13,&(this->m_glu).lusup,&(this->m_glu).xlusup,
                         &(this->m_glu).lsub,&(this->m_glu).xlsub,&(this->m_glu).supno,
                         &pGVar33->xsup);
              IVar4 = this->m_nnzU;
              piVar31 = (this->m_glu).xusub.
                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              pdVar19 = (this->m_glu).ucol.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
              piVar35 = (this->m_glu).usub.
                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              (this->m_Ustore).super_SparseMatrixBase<Eigen::MappedSparseMatrix<double,_0,_int>_>.
              m_isRValue = false;
              (this->m_Ustore).m_outerSize = iVar13;
              (this->m_Ustore).m_innerSize = m;
              (this->m_Ustore).m_nnz = IVar4;
              (this->m_Ustore).m_outerIndex = piVar31;
              (this->m_Ustore).m_innerIndices = piVar35;
              (this->m_Ustore).m_values = pdVar19;
              this->m_info = Success;
              this->m_factorizationIsOk = true;
LAB_00147514:
              free(__ptr);
              free((void *)local_108);
              free((void *)local_160);
              free(local_e8.m_data);
              free(local_c8.m_data);
              free(local_88.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              free(local_d8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              free((void *)relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows);
              free(local_a0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              free(local_118.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              free(_auStack_128);
              free(local_b0.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              return;
            }
          }
LAB_001475cc:
          pcVar23 = 
          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
          ;
LAB_001475e1:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,pcVar23);
        }
      }
    }
  }
LAB_0014772b:
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
               );
}

Assistant:

void SparseLU<MatrixType, OrderingType>::factorize(const MatrixType& matrix)
{
  using internal::emptyIdxLU;
  eigen_assert(m_analysisIsOk && "analyzePattern() should be called first"); 
  eigen_assert((matrix.rows() == matrix.cols()) && "Only for squared matrices");
  
  typedef typename IndexVector::Scalar Index; 
  
  
  // Apply the column permutation computed in analyzepattern()
  //   m_mat = matrix * m_perm_c.inverse(); 
  m_mat = matrix;
  if (m_perm_c.size()) 
  {
    m_mat.uncompress(); //NOTE: The effect of this command is only to create the InnerNonzeros pointers.
    //Then, permute only the column pointers
    const Index * outerIndexPtr;
    if (matrix.isCompressed()) outerIndexPtr = matrix.outerIndexPtr();
    else
    {
      Index* outerIndexPtr_t = new Index[matrix.cols()+1];
      for(Index i = 0; i <= matrix.cols(); i++) outerIndexPtr_t[i] = m_mat.outerIndexPtr()[i];
      outerIndexPtr = outerIndexPtr_t;
    }
    for (Index i = 0; i < matrix.cols(); i++)
    {
      m_mat.outerIndexPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i];
      m_mat.innerNonZeroPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i+1] - outerIndexPtr[i];
    }
    if(!matrix.isCompressed()) delete[] outerIndexPtr;
  } 
  else 
  { //FIXME This should not be needed if the empty permutation is handled transparently
    m_perm_c.resize(matrix.cols());
    for(Index i = 0; i < matrix.cols(); ++i) m_perm_c.indices()(i) = i;
  }
  
  Index m = m_mat.rows();
  Index n = m_mat.cols();
  Index nnz = m_mat.nonZeros();
  Index maxpanel = m_perfv.panel_size * m;
  // Allocate working storage common to the factor routines
  Index lwork = 0;
  Index info = Base::memInit(m, n, nnz, lwork, m_perfv.fillfactor, m_perfv.panel_size, m_glu); 
  if (info) 
  {
    m_lastError = "UNABLE TO ALLOCATE WORKING MEMORY\n\n" ;
    m_factorizationIsOk = false;
    return ; 
  }
  
  // Set up pointers for integer working arrays 
  IndexVector segrep(m); segrep.setZero();
  IndexVector parent(m); parent.setZero();
  IndexVector xplore(m); xplore.setZero();
  IndexVector repfnz(maxpanel);
  IndexVector panel_lsub(maxpanel);
  IndexVector xprune(n); xprune.setZero();
  IndexVector marker(m*internal::LUNoMarker); marker.setZero();
  
  repfnz.setConstant(-1); 
  panel_lsub.setConstant(-1);
  
  // Set up pointers for scalar working arrays 
  ScalarVector dense; 
  dense.setZero(maxpanel);
  ScalarVector tempv; 
  tempv.setZero(internal::LUnumTempV(m, m_perfv.panel_size, m_perfv.maxsuper, /*m_perfv.rowblk*/m) );
  
  // Compute the inverse of perm_c
  PermutationType iperm_c(m_perm_c.inverse()); 
  
  // Identify initial relaxed snodes
  IndexVector relax_end(n);
  if ( m_symmetricmode == true ) 
    Base::heap_relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  else
    Base::relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  
  
  m_perm_r.resize(m); 
  m_perm_r.indices().setConstant(-1);
  marker.setConstant(-1);
  m_detPermR = 1; // Record the determinant of the row permutation
  
  m_glu.supno(0) = emptyIdxLU; m_glu.xsup.setConstant(0);
  m_glu.xsup(0) = m_glu.xlsub(0) = m_glu.xusub(0) = m_glu.xlusup(0) = Index(0);
  
  // Work on one 'panel' at a time. A panel is one of the following :
  //  (a) a relaxed supernode at the bottom of the etree, or
  //  (b) panel_size contiguous columns, <panel_size> defined by the user
  Index jcol; 
  IndexVector panel_histo(n);
  Index pivrow; // Pivotal row number in the original row matrix
  Index nseg1; // Number of segments in U-column above panel row jcol
  Index nseg; // Number of segments in each U-column 
  Index irep; 
  Index i, k, jj; 
  for (jcol = 0; jcol < n; )
  {
    // Adjust panel size so that a panel won't overlap with the next relaxed snode. 
    Index panel_size = m_perfv.panel_size; // upper bound on panel width
    for (k = jcol + 1; k < (std::min)(jcol+panel_size, n); k++)
    {
      if (relax_end(k) != emptyIdxLU) 
      {
        panel_size = k - jcol; 
        break; 
      }
    }
    if (k == n) 
      panel_size = n - jcol; 
      
    // Symbolic outer factorization on a panel of columns 
    Base::panel_dfs(m, panel_size, jcol, m_mat, m_perm_r.indices(), nseg1, dense, panel_lsub, segrep, repfnz, xprune, marker, parent, xplore, m_glu); 
    
    // Numeric sup-panel updates in topological order 
    Base::panel_bmod(m, panel_size, jcol, nseg1, dense, tempv, segrep, repfnz, m_glu); 
    
    // Sparse LU within the panel, and below the panel diagonal 
    for ( jj = jcol; jj< jcol + panel_size; jj++) 
    {
      k = (jj - jcol) * m; // Column index for w-wide arrays 
      
      nseg = nseg1; // begin after all the panel segments
      //Depth-first-search for the current column
      VectorBlock<IndexVector> panel_lsubk(panel_lsub, k, m);
      VectorBlock<IndexVector> repfnz_k(repfnz, k, m); 
      info = Base::column_dfs(m, jj, m_perm_r.indices(), m_perfv.maxsuper, nseg, panel_lsubk, segrep, repfnz_k, xprune, marker, parent, xplore, m_glu); 
      if ( info ) 
      {
        m_lastError =  "UNABLE TO EXPAND MEMORY IN COLUMN_DFS() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      // Numeric updates to this column 
      VectorBlock<ScalarVector> dense_k(dense, k, m); 
      VectorBlock<IndexVector> segrep_k(segrep, nseg1, m-nseg1); 
      info = Base::column_bmod(jj, (nseg - nseg1), dense_k, tempv, segrep_k, repfnz_k, jcol, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COLUMN_BMOD() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Copy the U-segments to ucol(*)
      info = Base::copy_to_ucol(jj, nseg, segrep, repfnz_k ,m_perm_r.indices(), dense_k, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COPY_TO_UCOL() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Form the L-segment 
      info = Base::pivotL(jj, m_diagpivotthresh, m_perm_r.indices(), iperm_c.indices(), pivrow, m_glu);
      if ( info ) 
      {
        m_lastError = "THE MATRIX IS STRUCTURALLY SINGULAR ... ZERO COLUMN AT ";
        std::ostringstream returnInfo;
        returnInfo << info; 
        m_lastError += returnInfo.str();
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Update the determinant of the row permutation matrix
      if (pivrow != jj) m_detPermR *= -1;

      // Prune columns (0:jj-1) using column jj
      Base::pruneL(jj, m_perm_r.indices(), pivrow, nseg, segrep, repfnz_k, xprune, m_glu); 
      
      // Reset repfnz for this column 
      for (i = 0; i < nseg; i++)
      {
        irep = segrep(i); 
        repfnz_k(irep) = emptyIdxLU; 
      }
    } // end SparseLU within the panel  
    jcol += panel_size;  // Move to the next panel
  } // end for -- end elimination 
  
  // Count the number of nonzeros in factors 
  Base::countnz(n, m_nnzL, m_nnzU, m_glu); 
  // Apply permutation  to the L subscripts 
  Base::fixupL(n, m_perm_r.indices(), m_glu); 
  
  // Create supernode matrix L 
  m_Lstore.setInfos(m, n, m_glu.lusup, m_glu.xlusup, m_glu.lsub, m_glu.xlsub, m_glu.supno, m_glu.xsup); 
  // Create the column major upper sparse matrix  U; 
  new (&m_Ustore) MappedSparseMatrix<Scalar, ColMajor, Index> ( m, n, m_nnzU, m_glu.xusub.data(), m_glu.usub.data(), m_glu.ucol.data() ); 
  
  m_info = Success;
  m_factorizationIsOk = true;
}